

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

Long __thiscall amrex::BoxArray::numPts(BoxArray *this)

{
  long *plVar1;
  undefined8 uVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  Long LVar12;
  uint uVar13;
  int iVar14;
  int dir;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  IntVect IVar19;
  Box result;
  Box bx;
  undefined8 local_88;
  uint uStack_80;
  uint auStack_7c [2];
  undefined8 uStack_74;
  Box local_68;
  int local_40 [3];
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar10 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  uVar17 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - lVar10 >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar17) {
      lVar15 = 0;
      lVar11 = 0;
      do {
        uVar2 = *(undefined8 *)(lVar10 + 0xc + lVar15);
        lVar11 = lVar11 + (long)((*(int *)(lVar10 + 0x14 + lVar15) - *(int *)(lVar10 + 8 + lVar15))
                                + 1) *
                          (long)(((int)uVar2 - (int)*(undefined8 *)(lVar10 + lVar15)) + 1) *
                          (long)(((int)((ulong)uVar2 >> 0x20) -
                                 (int)((ulong)*(undefined8 *)(lVar10 + lVar15) >> 0x20)) + 1);
        lVar15 = lVar15 + 0x1c;
      } while ((ulong)(uVar17 & 0x7fffffff) * 0x1c != lVar15);
      return lVar11;
    }
    goto LAB_00454b1e;
  case indexType:
  case indexType_coarsenRatio:
    uVar13 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    uVar13 = 0;
    break;
  case bndryReg:
    if (0 < (int)uVar17) {
      uVar18 = (ulong)(uVar17 & 0x7fffffff);
      lVar15 = 0;
      lVar10 = 0;
      do {
        BATbndryReg::operator()
                  (&local_68,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(peVar3->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar15));
        lVar10 = lVar10 + (long)((local_68.bigend.vect[2] - local_68.smallend.vect[2]) + 1) *
                          (long)((local_68.bigend.vect[0] - local_68.smallend.vect[0]) + 1) *
                          (long)((local_68.bigend.vect[1] - local_68.smallend.vect[1]) + 1);
        lVar15 = lVar15 + 0x1c;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
      return lVar10;
    }
    goto LAB_00454b1e;
  default:
    uVar13 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar19 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar8 = IVar19.vect[2];
  local_40[0] = IVar19.vect[0];
  local_40[1] = IVar19.vect[1];
  local_40[2] = IVar19.vect[2];
  if ((int)uVar17 < 1) {
LAB_00454b1e:
    LVar12 = 0;
  }
  else {
    lVar10 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    iVar14 = IVar19.vect[0];
    iVar16 = IVar19.vect[1];
    uVar18 = 0;
    LVar12 = 0;
    do {
      plVar1 = (long *)(lVar10 + uVar18 * 0x1c);
      lVar15 = *plVar1;
      lVar11 = plVar1[1];
      plVar1 = (long *)(lVar10 + 0xc + uVar18 * 0x1c);
      lVar4 = *plVar1;
      lVar5 = plVar1[1];
      auStack_7c[1] = (uint)((ulong)lVar4 >> 0x20);
      uStack_74 = lVar5;
      uStack_80 = (uint)lVar11;
      auStack_7c[0] = (uint)((ulong)lVar11 >> 0x20);
      local_88._4_4_ = (uint)((ulong)lVar15 >> 0x20);
      uVar7 = local_88._4_4_;
      if (iVar16 == 1 && iVar14 == 1) {
        local_88 = lVar15;
        if (iVar8 != 1) goto LAB_004547dc;
      }
      else {
        local_88._0_4_ = (uint)lVar15;
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (int)(uint)local_88 >> 2;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 2;
            }
          }
          else if (iVar14 == 2) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (int)(uint)local_88 >> 1;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 1;
            }
          }
          else if ((int)(uint)local_88 < 0) {
            local_88._0_4_ = ~((int)~(uint)local_88 / iVar14);
          }
          else {
            local_88._0_4_ = (int)(uint)local_88 / iVar14;
          }
        }
        if (iVar16 != 1) {
          if (iVar16 == 4) {
            if (lVar15 < 0) {
              uVar7 = (int)local_88._4_4_ >> 2;
            }
            else {
              uVar7 = local_88._4_4_ >> 2;
            }
          }
          else if (iVar16 == 2) {
            if (lVar15 < 0) {
              uVar7 = (int)local_88._4_4_ >> 1;
            }
            else {
              uVar7 = local_88._4_4_ >> 1;
            }
          }
          else if (lVar15 < 0) {
            uVar7 = ~((int)~local_88._4_4_ / iVar16);
          }
          else {
            uVar7 = (int)local_88._4_4_ / iVar16;
          }
        }
LAB_004547dc:
        local_88 = CONCAT44(uVar7,(uint)local_88);
        if (iVar8 != 1) {
          if (iVar8 == 4) {
            if ((int)uStack_80 < 0) {
              uStack_80 = (int)uStack_80 >> 2;
            }
            else {
              uStack_80 = uStack_80 >> 2;
            }
          }
          else if (iVar8 == 2) {
            if ((int)uStack_80 < 0) {
              uStack_80 = (int)uStack_80 >> 1;
            }
            else {
              uStack_80 = uStack_80 >> 1;
            }
          }
          else if ((int)uStack_80 < 0) {
            uStack_80 = ~((int)~uStack_80 / iVar8);
          }
          else {
            uStack_80 = (int)uStack_80 / iVar8;
          }
        }
        uStack_74._4_4_ = (uint)((ulong)lVar5 >> 0x20);
        uStack_74._0_4_ = (uint)lVar5;
        if (uStack_74._4_4_ == 0) {
          uVar7 = auStack_7c[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar7 = (int)auStack_7c[0] >> 2;
              if (-1 < lVar11) {
                uVar7 = auStack_7c[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar7 = (int)auStack_7c[0] >> 1;
              if (-1 < lVar11) {
                uVar7 = auStack_7c[0] >> 1;
              }
            }
            else if (lVar11 < 0) {
              uVar7 = ~((int)~auStack_7c[0] / iVar14);
            }
            else {
              uVar7 = (int)auStack_7c[0] / iVar14;
            }
          }
          auStack_7c[0] = uVar7;
          uVar7 = auStack_7c[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar7 = (int)auStack_7c[1] >> 2;
              if (-1 < lVar4) {
                uVar7 = auStack_7c[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar7 = (int)auStack_7c[1] >> 1;
              if (-1 < lVar4) {
                uVar7 = auStack_7c[1] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar7 = ~((int)~auStack_7c[1] / iVar16);
            }
            else {
              uVar7 = (int)auStack_7c[1] / iVar16;
            }
          }
          auStack_7c[1] = uVar7;
          uVar7 = (uint)uStack_74;
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar7 = (int)(uint)uStack_74 >> 2;
              if (-1 < (int)(uint)uStack_74) {
                uVar7 = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar7 = (int)(uint)uStack_74 >> 1;
              if (-1 < (int)(uint)uStack_74) {
                uVar7 = (uint)uStack_74 >> 1;
              }
            }
            else if ((int)(uint)uStack_74 < 0) {
              uVar7 = ~((int)~(uint)uStack_74 / iVar8);
            }
            else {
              uVar7 = (int)(uint)uStack_74 / iVar8;
            }
          }
        }
        else {
          local_68.smallend.vect[0] = 0;
          local_68.smallend.vect[1] = 0;
          local_68.smallend.vect[2] = 0;
          lVar15 = 0;
          do {
            if (((uStack_74._4_4_ >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
               ((int)auStack_7c[lVar15] % local_40[lVar15] != 0)) {
              local_68.smallend.vect[lVar15] = 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          uVar7 = auStack_7c[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar7 = (int)auStack_7c[0] >> 2;
              if (-1 < lVar11) {
                uVar7 = auStack_7c[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar7 = (int)auStack_7c[0] >> 1;
              if (-1 < lVar11) {
                uVar7 = auStack_7c[0] >> 1;
              }
            }
            else if (lVar11 < 0) {
              uVar7 = ~((int)~auStack_7c[0] / iVar14);
            }
            else {
              uVar7 = (int)auStack_7c[0] / iVar14;
            }
          }
          uVar9 = auStack_7c[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar9 = (int)auStack_7c[1] >> 2;
              if (-1 < lVar4) {
                uVar9 = auStack_7c[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar9 = (int)auStack_7c[1] >> 1;
              if (-1 < lVar4) {
                uVar9 = auStack_7c[1] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar9 = ~((int)~auStack_7c[1] / iVar16);
            }
            else {
              uVar9 = (int)auStack_7c[1] / iVar16;
            }
          }
          uVar6 = (uint)uStack_74;
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar6 = (int)(uint)uStack_74 >> 2;
              if (-1 < (int)(uint)uStack_74) {
                uVar6 = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar6 = (int)(uint)uStack_74 >> 1;
              if (-1 < (int)(uint)uStack_74) {
                uVar6 = (uint)uStack_74 >> 1;
              }
            }
            else if ((int)(uint)uStack_74 < 0) {
              uVar6 = ~((int)~(uint)uStack_74 / iVar8);
            }
            else {
              uVar6 = (int)(uint)uStack_74 / iVar8;
            }
          }
          auStack_7c[0] = uVar7 + local_68.smallend.vect[0];
          auStack_7c[1] = uVar9 + local_68.smallend.vect[1];
          uVar7 = uVar6 + local_68.smallend.vect[2];
        }
        uStack_74 = CONCAT44(uStack_74._4_4_,uVar7);
      }
      local_68.bigend.vect[1] = auStack_7c[1];
      local_68.bigend.vect[2] = (uint)uStack_74;
      local_68.bigend.vect[0] = auStack_7c[0];
      lVar15 = 0;
      do {
        uVar9 = 1 << ((byte)lVar15 & 0x1f);
        uVar7 = (uint)lVar15;
        local_68.bigend.vect[lVar15] =
             (local_68.bigend.vect[lVar15] + (uint)((uVar13 >> (uVar7 & 0x1f) & 1) != 0)) -
             (uint)((uStack_74._4_4_ >> (uVar7 & 0x1f) & 1) != 0);
        if ((uVar13 >> (uVar7 & 0x1f) & 1) == 0) {
          uStack_74._4_4_ = ~uVar9 & uStack_74._4_4_;
        }
        else {
          uStack_74._4_4_ = uVar9 | uStack_74._4_4_;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      LVar12 = LVar12 + (long)(int)((local_68.bigend.vect[2] - uStack_80) + 1) *
                        (long)((local_68.bigend.vect[0] - (int)local_88) + 1) *
                        (long)((local_68.bigend.vect[1] - (int)((ulong)local_88 >> 0x20)) + 1);
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uVar17 & 0x7fffffff));
  }
  return LVar12;
}

Assistant:

Long
BoxArray::numPts () const noexcept
{
    Long result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).numPts();
        }
    }

    return result;
}